

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall BotscriptParser::parseSwitchCase(BotscriptParser *this)

{
  _Map_pointer ppSVar1;
  Lexer *pLVar2;
  _Map_pointer ppTVar3;
  _Map_pointer ppTVar4;
  _Elt_pointer pCVar5;
  bool bVar6;
  bool bVar7;
  _Elt_pointer pSVar8;
  difference_type __node_offset;
  long lVar9;
  difference_type __node_offset_1;
  CaseInfo *info;
  _Elt_pointer pCVar10;
  int iVar11;
  _Elt_pointer pTVar12;
  DataBuffer *this_00;
  _Map_pointer ppCVar13;
  _Elt_pointer pCVar14;
  uint local_3c;
  int local_38;
  int local_34;
  
  local_3c = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  iVar11 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_start._M_last - (long)pSVar8) >> 3) *
           0x677d46cf +
           (int)((ulong)((long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
           (int)((ulong)((long)ppSVar1 -
                        (long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
           (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar11 <= (int)local_3c) {
    local_34 = iVar11;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,(int *)&local_3c,&local_34);
    pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  lVar9 = ((long)pSVar8 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
          (long)(int)local_3c;
  if (lVar9 == 0) {
    pSVar8 = pSVar8 + (int)local_3c;
  }
  else {
    pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar9];
  }
  if (pSVar8->type != SCOPE_Switch) {
    error<>("case label outside switch");
  }
  bVar7 = Lexer::next(this->m_lexer,Minus);
  Lexer::mustGetNext(this->m_lexer,Number);
  pLVar2 = this->m_lexer;
  pTVar12 = (pLVar2->m_tokenPosition)._M_cur;
  ppTVar3 = (pLVar2->m_tokenPosition)._M_node;
  ppTVar4 = (pLVar2->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar6 = ppTVar3 < ppTVar4;
  if (ppTVar3 == ppTVar4) {
    bVar6 = pTVar12 < (pLVar2->m_tokens)._deque.
                      super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar6) {
    ppTVar4 = (pLVar2->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar6 = ppTVar4 <= ppTVar3;
    if (ppTVar3 == ppTVar4) {
      bVar6 = (pLVar2->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar12;
    }
    if (bVar6) goto LAB_00127de2;
  }
  local_3c = local_3c & 0xffffff00;
  local_34 = CONCAT31(local_34._1_3_,1);
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,(bool *)&local_3c,(bool *)&local_34);
  pTVar12 = (pLVar2->m_tokenPosition)._M_cur;
LAB_00127de2:
  lVar9 = String::toLong(&pTVar12->text,(bool *)0x0,10);
  local_38 = -(int)lVar9;
  if (!bVar7) {
    local_38 = (int)lVar9;
  }
  Lexer::mustGetNext(this->m_lexer,Colon);
  local_3c = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  iVar11 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_start._M_last - (long)pSVar8) >> 3) *
           0x677d46cf +
           (int)((ulong)((long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
           (int)((ulong)((long)ppSVar1 -
                        (long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
           (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar11 <= (int)local_3c) {
    local_34 = iVar11;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,(int *)&local_3c,&local_34);
    pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  lVar9 = ((long)pSVar8 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
          (long)(int)local_3c;
  if (lVar9 == 0) {
    pSVar8 = pSVar8 + (int)local_3c;
  }
  else {
    pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar9];
  }
  pCVar10 = (pSVar8->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pCVar5 = (pSVar8->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pCVar10 != pCVar5) {
    pCVar14 = (pSVar8->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppCVar13 = (pSVar8->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl
               .super__Deque_impl_data._M_start._M_node;
    do {
      if (pCVar10->number == local_38) {
        error<int>("multiple case %1 labels in one switch",&local_38);
      }
      pCVar10 = pCVar10 + 1;
      if (pCVar10 == pCVar14) {
        pCVar10 = ppCVar13[1];
        ppCVar13 = ppCVar13 + 1;
        pCVar14 = pCVar10 + 0x15;
      }
    } while (pCVar10 != pCVar5);
  }
  this->m_switchBuffer = (DataBuffer *)0x0;
  lVar9 = 0x18;
  if (this->m_currentMode != MainLoop) {
    lVar9 = (ulong)(this->m_currentMode == Onenter) * 8 + 8;
  }
  DataBuffer::writeHeader(*(DataBuffer **)(&this->m_isReadOnly + lVar9),CaseGoto);
  this_00 = this->m_switchBuffer;
  if (this_00 == (DataBuffer *)0x0) {
    if (this->m_currentMode == Onenter) {
      this_00 = this->m_onenterBuffer;
    }
    else if (this->m_currentMode == MainLoop) {
      this_00 = this->m_mainLoopBuffer;
    }
    else {
      this_00 = this->m_mainBuffer;
    }
  }
  DataBuffer::writeDWord(this_00,local_38);
  addSwitchCase(this,(DataBuffer *)0x0);
  iVar11 = local_38;
  local_3c = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_34 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_last - (long)pSVar8) >> 3) *
             0x677d46cf +
             (int)((ulong)((long)(this->m_scopeStack)._deque.
                                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
             (int)((ulong)((long)ppSVar1 -
                          (long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
             (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (local_34 <= (int)local_3c) {
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,(int *)&local_3c,&local_34);
    pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  lVar9 = ((long)pSVar8 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
          (long)(int)local_3c;
  if (lVar9 == 0) {
    pSVar8 = pSVar8 + (int)local_3c;
  }
  else {
    pSVar8 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar9];
  }
  pSVar8->casecursor->number = iVar11;
  return;
}

Assistant:

void BotscriptParser::parseSwitchCase()
{
	// case is only allowed inside switch
	if (SCOPE (0).type != SCOPE_Switch)
		error ("case label outside switch");

	// Get a literal value for the case block. Zandronum does not support
	// expressions here.
	bool isNegative = m_lexer->next(Token::Minus);
	m_lexer->mustGetNext (Token::Number);
	int num = m_lexer->token()->text.toLong();
	if (isNegative) {
		num = -num;
	}
	m_lexer->mustGetNext (Token::Colon);

	for (const CaseInfo& info : SCOPE(0).cases)
	{
		if (info.number == num)
			error ("multiple case %1 labels in one switch", num);
	}

	// Write down the expression and case-go-to. This builds
	// the case tree. The closing event will write the actual
	// blocks and move the marks appropriately.
	//
	// AddSwitchCase will add the reference to the mark
	// for the case block that this heralds, and takes care
	// of buffering setup and stuff like that.
	//
	// We null the switch buffer for the case-go-to statement as
	// we want it all under the switch, not into the case-buffers.
	m_switchBuffer = nullptr;
	currentBuffer()->writeHeader (DataHeader::CaseGoto);
	currentBuffer()->writeDWord (num);
	addSwitchCase (null);
	SCOPE (0).casecursor->number = num;
}